

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

void __thiscall QHostAddress::setAddress(QHostAddress *this,sockaddr *sockaddr)

{
  uint uVar1;
  
  QExplicitlySharedDataPointer<QHostAddressPrivate>::detach(&this->d);
  clear(this);
  if (sockaddr->sa_family == 10) {
    setAddress(this,(quint8 *)(sockaddr->sa_data + 6));
    return;
  }
  if (sockaddr->sa_family == 2) {
    uVar1 = *(uint *)(sockaddr->sa_data + 2);
    setAddress(this,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    return;
  }
  return;
}

Assistant:

void QHostAddress::setAddress(const struct sockaddr *sockaddr)
{
    d.detach();
    clear();
    if (sockaddr->sa_family == AF_INET)
        setAddress(htonl(((const sockaddr_in *)sockaddr)->sin_addr.s_addr));
    else if (sockaddr->sa_family == AF_INET6)
        setAddress(((const sockaddr_in6 *)sockaddr)->sin6_addr.s6_addr);
}